

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
::FindEntryWithKey<JsUtil::CharacterBuffer<char16_t>>
          (BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
           *this,CharacterBuffer<char16_t> *key)

{
  long lVar1;
  JavascriptString *pJVar2;
  char16_t *string2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  charcount_t cVar6;
  int iVar7;
  undefined4 *puVar8;
  char16 *pcVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  hash_t hashCode;
  uint depth;
  
  lVar1 = *(long *)this;
  depth = 0;
  if (lVar1 != 0) {
    if ((ulong)key->len == 0) {
      hashCode = 0x2393b8b;
    }
    else {
      uVar12 = 0x811c9dc5;
      uVar10 = 0;
      do {
        uVar14 = (ushort)(key->string).ptr[uVar10] ^ uVar12;
        uVar12 = uVar14 * 0x1000193;
        uVar10 = uVar10 + 1;
      } while (key->len != uVar10);
      hashCode = uVar14 * 0x2000326 + 1;
    }
    uVar5 = BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
            ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar12 = *(uint *)(lVar1 + (ulong)uVar5 * 4);
    if (-1 < (int)uVar12) {
      lVar1 = *(long *)(this + 8);
      depth = 0;
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        pJVar2 = *(JavascriptString **)(lVar1 + 0x10 + (ulong)uVar12 * 0x20);
        pcVar9 = Js::JavascriptString::GetString(pJVar2);
        cVar6 = Js::JavascriptString::GetLength(pJVar2);
        if (cVar6 == 0) {
          iVar7 = 0x2393b8b;
        }
        else {
          uVar14 = 0x811c9dc5;
          uVar10 = 0;
          do {
            uVar13 = (ushort)pcVar9[uVar10] ^ uVar14;
            uVar14 = uVar13 * 0x1000193;
            uVar10 = uVar10 + 1;
          } while (cVar6 != uVar10);
          iVar7 = uVar13 * 0x2000326 + 1;
        }
        lVar11 = (ulong)uVar12 * 0x20 + lVar1;
        if (iVar7 != *(int *)(lVar11 + 0x18)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                             ,199,
                             "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                             ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar8 = 0;
        }
        if (*(hash_t *)(lVar11 + 0x18) == hashCode) {
          pJVar2 = *(JavascriptString **)(lVar11 + 0x10);
          cVar6 = Js::JavascriptString::GetLength(pJVar2);
          if (cVar6 == key->len) {
            pcVar9 = Js::JavascriptString::GetString(pJVar2);
            string2 = (key->string).ptr;
            cVar6 = Js::JavascriptString::GetLength(pJVar2);
            if ((pcVar9 == string2) ||
               (iVar7 = PAL_wmemcmp(pcVar9,string2,(ulong)cVar6), iVar7 == 0)) {
              if (*(DictionaryStats **)(this + 0x30) == (DictionaryStats *)0x0) {
                return uVar12;
              }
              DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
              return uVar12;
            }
          }
        }
        depth = depth + 1;
        uVar12 = *(uint *)(lVar11 + 8);
      } while (-1 < (int)uVar12);
    }
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
  }
  return -1;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }